

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigCheck(Abc_Aig_t *pMan)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  char *pcVar6;
  int local_34;
  int Counter;
  int nFanins;
  int i;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *pObj;
  Abc_Aig_t *pMan_local;
  
  Counter = 0;
  do {
    iVar2 = Vec_PtrSize(pMan->pNtkAig->vObjs);
    if (iVar2 <= Counter) {
      local_34 = 0;
      for (Counter = 0; Counter < pMan->nBins; Counter = Counter + 1) {
        for (_nFanins = pMan->pBins[Counter]; _nFanins != (Abc_Obj_t *)0x0;
            _nFanins = _nFanins->pNext) {
          local_34 = local_34 + 1;
        }
      }
      iVar2 = Abc_NtkNodeNum(pMan->pNtkAig);
      if (local_34 == iVar2) {
        for (Counter = 0; iVar2 = Vec_PtrSize(pMan->pNtkAig->vObjs), Counter < iVar2;
            Counter = Counter + 1) {
          pAVar4 = Abc_NtkObj(pMan->pNtkAig,Counter);
          if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) &&
             (iVar2 = Abc_AigNodeIsChoice(pAVar4), iVar2 != 0)) {
            for (_nFanins = (Abc_Obj_t *)(pAVar4->field_5).pData; _nFanins != (Abc_Obj_t *)0x0;
                _nFanins = (Abc_Obj_t *)(_nFanins->field_5).pData) {
              iVar2 = Abc_ObjFanoutNum(_nFanins);
              if (0 < iVar2) {
                pcVar6 = Abc_ObjName(_nFanins);
                printf("Abc_AigCheck: Representative %s",pcVar6);
                pcVar6 = Abc_ObjName(pAVar4);
                uVar3 = Abc_ObjFanoutNum(_nFanins);
                printf(" of choice node %s has %d fanouts.\n",pcVar6,(ulong)uVar3);
                return 0;
              }
            }
          }
        }
        pMan_local._4_4_ = 1;
      }
      else {
        printf("Abc_AigCheck: The number of nodes in the structural hashing table is wrong.\n");
        pMan_local._4_4_ = 0;
      }
      return pMan_local._4_4_;
    }
    pAVar4 = Abc_NtkObj(pMan->pNtkAig,Counter);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) {
      iVar2 = Abc_ObjFaninNum(pAVar4);
      if (iVar2 == 0) {
        iVar2 = Abc_AigNodeIsConst(pAVar4);
        if (iVar2 == 0) {
          printf("Abc_AigCheck: The AIG has non-standard constant nodes.\n");
          return 0;
        }
      }
      else {
        if (iVar2 == 1) {
          printf("Abc_AigCheck: The AIG has single input nodes.\n");
          return 0;
        }
        if (2 < iVar2) {
          printf("Abc_AigCheck: The AIG has non-standard nodes.\n");
          return 0;
        }
        uVar3 = *(uint *)&pAVar4->field_0x14;
        pAVar5 = Abc_ObjFanin0(pAVar4);
        uVar1 = *(uint *)&pAVar5->field_0x14;
        pAVar5 = Abc_ObjFanin1(pAVar4);
        iVar2 = Abc_MaxInt(uVar1 >> 0xc,*(uint *)&pAVar5->field_0x14 >> 0xc);
        if (uVar3 >> 0xc != iVar2 + 1U) {
          pcVar6 = Abc_ObjName(pAVar4);
          printf("Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n",
                 pcVar6);
        }
        pAVar5 = Abc_ObjChild0(pAVar4);
        p1 = Abc_ObjChild1(pAVar4);
        pAVar5 = Abc_AigAndLookup(pMan,pAVar5,p1);
        if (pAVar5 != pAVar4) {
          pcVar6 = Abc_ObjName(pAVar4);
          printf("Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n",pcVar6);
        }
      }
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

int Abc_AigCheck( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pObj, * pAnd;
    int i, nFanins, Counter;
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
    {
        nFanins = Abc_ObjFaninNum(pObj);
        if ( nFanins == 0 )
        {
            if ( !Abc_AigNodeIsConst(pObj) )
            {
                printf( "Abc_AigCheck: The AIG has non-standard constant nodes.\n" );
                return 0;
            }
            continue;
        }
        if ( nFanins == 1 )
        {
            printf( "Abc_AigCheck: The AIG has single input nodes.\n" );
            return 0;
        }
        if ( nFanins > 2 )
        {
            printf( "Abc_AigCheck: The AIG has non-standard nodes.\n" );
            return 0;
        }
        if ( pObj->Level != 1 + (unsigned)Abc_MaxInt( Abc_ObjFanin0(pObj)->Level, Abc_ObjFanin1(pObj)->Level ) )
            printf( "Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n", Abc_ObjName(pObj) );
        pAnd = Abc_AigAndLookup( pMan, Abc_ObjChild0(pObj), Abc_ObjChild1(pObj) );
        if ( pAnd != pObj )
            printf( "Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n", Abc_ObjName(pObj) );
    }
    // count the number of nodes in the table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            Counter++;
    if ( Counter != Abc_NtkNodeNum(pMan->pNtkAig) )
    {
        printf( "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
    // if the node is a choice node, nodes in its class should not have fanouts
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
        if ( Abc_AigNodeIsChoice(pObj) )
            for ( pAnd = (Abc_Obj_t *)pObj->pData; pAnd; pAnd = (Abc_Obj_t *)pAnd->pData )
                if ( Abc_ObjFanoutNum(pAnd) > 0 )
                {
                    printf( "Abc_AigCheck: Representative %s", Abc_ObjName(pAnd) );
                    printf( " of choice node %s has %d fanouts.\n", Abc_ObjName(pObj), Abc_ObjFanoutNum(pAnd) );
                    return 0;
                }
    return 1;
}